

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attributes.c
# Opt level: O2

exr_result_t attr_destroy(_internal_exr_context *ctxt,exr_attribute_t *attr)

{
  exr_attribute_type_t eVar1;
  exr_result_t eVar2;
  
  eVar1 = attr->type;
  if (eVar1 == EXR_ATTR_OPAQUE) {
    eVar2 = exr_attr_opaquedata_destroy((exr_context_t)ctxt,(attr->field_6).opaque);
  }
  else if (eVar1 == EXR_ATTR_FLOAT_VECTOR) {
    eVar2 = exr_attr_float_vector_destroy((exr_context_t)ctxt,(attr->field_6).floatvector);
  }
  else if (eVar1 == EXR_ATTR_PREVIEW) {
    eVar2 = exr_attr_preview_destroy((exr_context_t)ctxt,(attr->field_6).preview);
  }
  else if (eVar1 == EXR_ATTR_STRING) {
    eVar2 = exr_attr_string_destroy((exr_context_t)ctxt,(attr->field_6).string);
  }
  else if (eVar1 == EXR_ATTR_STRING_VECTOR) {
    eVar2 = exr_attr_string_vector_destroy((exr_context_t)ctxt,(attr->field_6).stringvector);
  }
  else {
    eVar2 = 0;
    if (eVar1 == EXR_ATTR_CHLIST) {
      eVar2 = exr_attr_chlist_destroy((exr_context_t)ctxt,(attr->field_6).chlist);
    }
  }
  (*ctxt->free_fn)(attr);
  return eVar2;
}

Assistant:

static exr_result_t
attr_destroy (struct _internal_exr_context* ctxt, exr_attribute_t* attr)
{
    exr_result_t rv = EXR_ERR_SUCCESS;
    switch (attr->type)
    {
        case EXR_ATTR_CHLIST:
            rv = exr_attr_chlist_destroy ((exr_context_t) ctxt, attr->chlist);
            break;
        case EXR_ATTR_FLOAT_VECTOR:
            rv = exr_attr_float_vector_destroy (
                (exr_context_t) ctxt, attr->floatvector);
            break;
        case EXR_ATTR_PREVIEW:
            rv = exr_attr_preview_destroy ((exr_context_t) ctxt, attr->preview);
            break;
        case EXR_ATTR_STRING:
            rv = exr_attr_string_destroy ((exr_context_t) ctxt, attr->string);
            break;
        case EXR_ATTR_STRING_VECTOR:
            rv = exr_attr_string_vector_destroy (
                (exr_context_t) ctxt, attr->stringvector);
            break;
        case EXR_ATTR_OPAQUE:
            rv = exr_attr_opaquedata_destroy (
                (exr_context_t) ctxt, attr->opaque);
            break;
        case EXR_ATTR_BOX2I:
        case EXR_ATTR_BOX2F:
        case EXR_ATTR_CHROMATICITIES:
        case EXR_ATTR_COMPRESSION:
        case EXR_ATTR_ENVMAP:
        case EXR_ATTR_LINEORDER:
        case EXR_ATTR_DOUBLE:
        case EXR_ATTR_FLOAT:
        case EXR_ATTR_INT:
        case EXR_ATTR_KEYCODE:
        case EXR_ATTR_M33F:
        case EXR_ATTR_M33D:
        case EXR_ATTR_M44F:
        case EXR_ATTR_M44D:
        case EXR_ATTR_RATIONAL:
        case EXR_ATTR_TILEDESC:
        case EXR_ATTR_TIMECODE:
        case EXR_ATTR_V2I:
        case EXR_ATTR_V2F:
        case EXR_ATTR_V2D:
        case EXR_ATTR_V3I:
        case EXR_ATTR_V3F:
        case EXR_ATTR_V3D:
        case EXR_ATTR_UNKNOWN:
        case EXR_ATTR_LAST_KNOWN_TYPE:
        default: break;
    }
    /* we don't care about the string because they were built into the
     * allocation block of the attribute as necessary */
    ctxt->free_fn (attr);
    return rv;
}